

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

directed_flag_complex_coboundary_cell_t * __thiscall
directed_flag_complex_cell_t::insert_vertex
          (directed_flag_complex_cell_t *this,size_t position,vertex_index_t vertex)

{
  vertex_index_t in_CX;
  vertex_index_t *in_RDX;
  directed_flag_complex_coboundary_cell_t *in_RSI;
  directed_flag_complex_coboundary_cell_t *in_RDI;
  unsigned_short in_stack_ffffffffffffffe4;
  
  directed_flag_complex_coboundary_cell_t::directed_flag_complex_coboundary_cell_t
            (in_RSI,in_RDX,in_CX,in_stack_ffffffffffffffe4);
  return in_RDI;
}

Assistant:

directed_flag_complex_coboundary_cell_t directed_flag_complex_cell_t::insert_vertex(size_t position,
                                                                                    vertex_index_t vertex) {
#ifdef USE_CELLS_WITHOUT_DIMENSION
	return directed_flag_complex_coboundary_cell_t(vertices, vertex, (unsigned short)position);
#else
	return directed_flag_complex_coboundary_cell_t(dim, vertices, vertex, (unsigned short)position);
#endif
}